

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_max_streams_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state,int uni)

{
  int in_EDX;
  undefined8 in_RSI;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_max_streams_frame_t frame;
  quicly_max_streams_frame_t *in_stack_ffffffffffffffc8;
  st_quicly_max_streams_t *m;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t **in_stack_ffffffffffffffd8;
  int uni_00;
  int local_4;
  
  uni_00 = (int)((ulong)in_RSI >> 0x20);
  local_4 = quicly_decode_max_streams_frame
                      (in_stack_ffffffffffffffd8,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (in_EDX == 0) {
      m = &(in_RDI->egress).max_streams.bidi;
    }
    else {
      m = &(in_RDI->egress).max_streams.uni;
    }
    local_4 = update_max_streams(m,(uint64_t)in_stack_ffffffffffffffd8);
    if (local_4 == 0) {
      open_blocked_streams(in_RDI,uni_00);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int handle_max_streams_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state, int uni)
{
    quicly_max_streams_frame_t frame;
    int ret;

    if ((ret = quicly_decode_max_streams_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_STREAMS_RECEIVE, conn, conn->stash.now, frame.count, uni);

    if ((ret = update_max_streams(uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi, frame.count)) != 0)
        return ret;

    open_blocked_streams(conn, uni);

    return 0;
}